

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model_removeAllComponentsImportedChild_Test::~Model_removeAllComponentsImportedChild_Test
          (Model_removeAllComponentsImportedChild_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Model, removeAllComponentsImportedChild)
{
    auto model = libcellml::Model::create();
    auto c1 = libcellml::Component::create("c1");
    auto c2 = libcellml::Component::create("c2");
    auto import = libcellml::ImportSource::create();
    c2->setImportSource(import);
    model->addComponent(c2);
    model->addComponent(c1);
    EXPECT_EQ(size_t(2), model->componentCount());

    model->removeAllComponents();
    EXPECT_EQ(size_t(0), model->componentCount());
}